

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_sha256_init_create(secp256k1_sha256 *hash)

{
  secp256k1_sha256 *in_RDI;
  
  secp256k1_sha256_initialize(in_RDI);
  in_RDI->s[0] = 0xd29e1bf5;
  in_RDI->s[1] = 0xf7025f42;
  in_RDI->s[2] = 0x9b024773;
  in_RDI->s[3] = 0x94cb7d5;
  in_RDI->s[4] = 0xe59ed789;
  in_RDI->s[5] = 0x3bc9786;
  in_RDI->s[6] = 0x68335b35;
  in_RDI->s[7] = 0x4e363b53;
  in_RDI->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_ellswift_sha256_init_create(secp256k1_sha256* hash) {
    secp256k1_sha256_initialize(hash);
    hash->s[0] = 0xd29e1bf5ul;
    hash->s[1] = 0xf7025f42ul;
    hash->s[2] = 0x9b024773ul;
    hash->s[3] = 0x094cb7d5ul;
    hash->s[4] = 0xe59ed789ul;
    hash->s[5] = 0x03bc9786ul;
    hash->s[6] = 0x68335b35ul;
    hash->s[7] = 0x4e363b53ul;

    hash->bytes = 64;
}